

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

Snapshot * __thiscall
cmState::Snapshot::GetBuildsystemDirectoryParent(Snapshot *__return_storage_ptr__,Snapshot *this)

{
  PositionType position;
  bool bVar1;
  PointerType pSVar2;
  Snapshot *snapshot;
  bool local_79;
  Snapshot local_68;
  iterator local_50;
  undefined1 local_40 [8];
  PositionType parentPos;
  PositionType local_20;
  Snapshot *local_10;
  Snapshot *this_local;
  
  local_10 = this;
  cmLinkedTree<cmState::SnapshotDataType>::iterator::iterator(&local_20);
  Snapshot(__return_storage_ptr__,(cmState *)0x0,local_20);
  local_79 = true;
  if (this->State != (cmState *)0x0) {
    join_0x00000010_0x00000000_ =
         cmLinkedTree<cmState::SnapshotDataType>::Root(&this->State->SnapshotData);
    local_79 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator==
                         (&this->Position,join_0x00000010_0x00000000_);
  }
  if (local_79 == false) {
    pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&this->Position);
    local_40 = (undefined1  [8])(pSVar2->DirectoryParent).Tree;
    parentPos.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)(pSVar2->DirectoryParent).Position;
    local_50 = cmLinkedTree<cmState::SnapshotDataType>::Root(&this->State->SnapshotData);
    bVar1 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator!=
                      ((iterator *)local_40,local_50);
    if (bVar1) {
      position.Position = (PositionType)parentPos.Tree;
      position.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)local_40;
      Snapshot(&local_68,this->State,position);
      __return_storage_ptr__->State = local_68.State;
      (__return_storage_ptr__->Position).Tree = local_68.Position.Tree;
      (__return_storage_ptr__->Position).Position = local_68.Position.Position;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

cmState::Snapshot cmState::Snapshot::GetBuildsystemDirectoryParent() const
{
  Snapshot snapshot;
  if (!this->State || this->Position == this->State->SnapshotData.Root())
    {
    return snapshot;
    }
  PositionType parentPos = this->Position->DirectoryParent;
  if (parentPos != this->State->SnapshotData.Root())
    {
    snapshot = Snapshot(this->State, parentPos);
    }

  return snapshot;
}